

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printMemReference(MCInst *MI,uint Op,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  MCOperand *op;
  MCOperand *pMVar5;
  int64_t iVar6;
  MCInst *MI_00;
  MCOperand *op_00;
  uint8_t *puVar7;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  bool bVar8;
  int64_t DispVal;
  uint8_t access [6];
  int reg;
  MCOperand *SegReg;
  MCOperand *DispSpec;
  MCOperand *IndexReg;
  uint64_t ScaleVal;
  MCOperand *BaseReg;
  _Bool NeedPlus;
  cs_struct *in_stack_ffffffffffffff98;
  SStream *in_stack_ffffffffffffffa0;
  SStream *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint OpNo;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  pMVar5 = MCInst_getOperand(in_RDI,in_ESI + 1);
  iVar6 = MCOperand_getImm(pMVar5);
  pMVar5 = MCInst_getOperand(in_RDI,in_ESI + 2);
  MI_00 = (MCInst *)MCInst_getOperand(in_RDI,in_ESI + 3);
  op_00 = MCInst_getOperand(in_RDI,in_ESI + 4);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar7 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
    puVar7[0] = '\x03';
    puVar7[1] = '\0';
    puVar7[2] = '\0';
    puVar7[3] = '\0';
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = in_RDI->x86opsize;
    puVar7 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d;
    puVar7[0] = '\0';
    puVar7[1] = '\0';
    puVar7[2] = '\0';
    puVar7[3] = '\0';
    uVar3 = MCOperand_getReg(op);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x61) = uVar3;
    uVar3 = MCOperand_getReg(pMVar5);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x65) = uVar3;
    *(int *)(in_RDI->flat_insn->detail->groups +
            (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x69) = (int)iVar6;
    puVar7 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x6d;
    puVar7[0] = '\0';
    puVar7[1] = '\0';
    puVar7[2] = '\0';
    puVar7[3] = '\0';
    puVar7[4] = '\0';
    puVar7[5] = '\0';
    puVar7[6] = '\0';
    puVar7[7] = '\0';
    in_stack_ffffffffffffff98 = in_RDI->csh;
    MCInst_getOpcode(in_RDI);
    get_op_access((cs_struct *)MI_00,(uint)((ulong)op_00 >> 0x20),
                  (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (uint64_t *)in_stack_ffffffffffffffa8);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x76] =
         (&stack0xffffffffffffffae)[(in_RDI->flat_insn->detail->field_6).x86.op_count];
  }
  uVar3 = MCOperand_getReg(op_00);
  OpNo = (uint)((ulong)op_00 >> 0x20);
  if (uVar3 != 0) {
    _printOperand(MI_00,OpNo,(SStream *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d) = uVar3;
    }
    SStream_concat0(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  }
  SStream_concat0(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  uVar4 = MCOperand_getReg(op);
  bVar8 = uVar4 != 0;
  if (bVar8) {
    _printOperand(MI_00,OpNo,(SStream *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
  }
  uVar4 = MCOperand_getReg(pMVar5);
  if (uVar4 != 0) {
    if (bVar8) {
      SStream_concat0(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    }
    _printOperand(MI_00,OpNo,(SStream *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
    if (iVar6 != 1) {
      SStream_concat(in_RDX,"*%u",iVar6);
    }
    bVar8 = true;
  }
  _Var2 = MCOperand_isImm((MCOperand *)MI_00);
  if (_Var2) {
    in_stack_ffffffffffffffa0 = (SStream *)MCOperand_getImm((MCOperand *)MI_00);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(SStream **)
       (in_RDI->flat_insn->detail->groups +
       (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x6d) =
           in_stack_ffffffffffffffa0;
    }
    if (in_stack_ffffffffffffffa0 == (SStream *)0x0) {
      if (!bVar8) {
        SStream_concat0((SStream *)0x0,(char *)in_stack_ffffffffffffff98);
      }
    }
    else if (bVar8) {
      if ((long)in_stack_ffffffffffffffa0 < 0) {
        SStream_concat0(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        printImm((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (int64_t)in_stack_ffffffffffffffa0,
                 SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
      }
      else {
        SStream_concat0(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        printImm((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (int64_t)in_stack_ffffffffffffffa0,
                 SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
      }
    }
    else {
      _Var2 = SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0);
      if ((long)in_stack_ffffffffffffffa0 < 0) {
        printImm((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (int64_t)in_stack_ffffffffffffffa0,_Var2);
      }
      else {
        printImm((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (int64_t)in_stack_ffffffffffffffa0,_Var2);
      }
    }
  }
  SStream_concat0(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
  }
  if (in_RDI->op1_size == '\0') {
    in_RDI->op1_size = in_RDI->x86opsize;
  }
  return;
}

Assistant:

static void printMemReference(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *BaseReg  = MCInst_getOperand(MI, Op + X86_AddrBaseReg);
	MCOperand *IndexReg  = MCInst_getOperand(MI, Op + X86_AddrIndexReg);
	MCOperand *DispSpec = MCInst_getOperand(MI, Op + X86_AddrDisp);
	MCOperand *SegReg = MCInst_getOperand(MI, Op + X86_AddrSegmentReg);
	uint64_t ScaleVal;
	int segreg;
	int64_t DispVal = 1;

	if (MI->csh->detail) {
		uint8_t access[6];

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = MCOperand_getReg(BaseReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = MCOperand_getReg(IndexReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;

		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
	}

	// If this has a segment register, print it.
	segreg = MCOperand_getReg(SegReg);
	if (segreg) {
		_printOperand(MI, Op + X86_AddrSegmentReg, O);
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = segreg;
		}

		SStream_concat0(O, ":");
	}

	if (MCOperand_isImm(DispSpec)) {
		DispVal = MCOperand_getImm(DispSpec);
		if (MI->csh->detail)
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = DispVal;
		if (DispVal) {
			if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
				printInt64(O, DispVal);
			} else {
				// only immediate as address of memory
				if (DispVal < 0) {
					SStream_concat(O, "0x%"PRIx64, arch_masks[MI->csh->mode] & DispVal);
				} else {
					if (DispVal > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, DispVal);
					else
						SStream_concat(O, "%"PRIu64, DispVal);
				}
			}
		} else {
		}
	}

	if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
		SStream_concat0(O, "(");

		if (MCOperand_getReg(BaseReg))
			_printOperand(MI, Op + X86_AddrBaseReg, O);

		if (MCOperand_getReg(IndexReg)) {
			SStream_concat0(O, ", ");
			_printOperand(MI, Op + X86_AddrIndexReg, O);
			ScaleVal = MCOperand_getImm(MCInst_getOperand(MI, Op + X86_AddrScaleAmt));
			if (MI->csh->detail)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = (int)ScaleVal;
			if (ScaleVal != 1) {
				SStream_concat(O, ", %u", ScaleVal);
			}
		}
		SStream_concat0(O, ")");
	} else {
		if (!DispVal)
			SStream_concat0(O, "0");
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->x86.op_count++;
}